

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::WildcardPattern::normaliseString
          (string *__return_storage_ptr__,WildcardPattern *this,string *str)

{
  pointer pcVar1;
  string local_28;
  
  if (this->m_caseSensitivity == No) {
    toLower(&local_28,str);
  }
  else {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_28,pcVar1,pcVar1 + str->_M_string_length);
  }
  trim(__return_storage_ptr__,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }